

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_step(lua_State *L)

{
  lu_byte lVar1;
  global_State *g_00;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  if (g_00->gcstp != '\0') {
    if ((g_00->gcstp & 1) == 0) {
      return;
    }
    luaE_setdebt(g_00,20000);
    return;
  }
  lVar1 = g_00->gckind;
  if (lVar1 != '\0') {
    if (lVar1 == '\x01') {
      youngcollection(L,g_00);
      setminordebt(g_00);
      return;
    }
    if (lVar1 != '\x02') {
      return;
    }
  }
  incstep(L,g_00);
  return;
}

Assistant:

void luaC_step (lua_State *L) {
  global_State *g = G(L);
  lua_assert(!g->gcemergency);
  if (!gcrunning(g)) {  /* not running? */
    if (g->gcstp & GCSTPUSR)  /* stopped by the user? */
      luaE_setdebt(g, 20000);
  }
  else {
    luai_tracegc(L, 1);  /* for internal debugging */
    switch (g->gckind) {
      case KGC_INC: case KGC_GENMAJOR:
        incstep(L, g);
        break;
      case KGC_GENMINOR:
        youngcollection(L, g);
        setminordebt(g);
        break;
    }
    luai_tracegc(L, 0);  /* for internal debugging */
  }
}